

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.h
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
rlib::midi::EventMeta::midiMessage
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          EventMeta *this)

{
  ulong uVar1;
  initializer_list<unsigned_char> __l;
  vector<unsigned_char,_std::allocator<unsigned_char>_> s;
  allocator_type local_39;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = CONCAT11((char)this->type,0xff);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__l,&local_39);
  uVar1 = (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((uVar1 & 0xfe000000000000) != 0) {
    local_39 = (allocator_type)((byte)(uVar1 >> 0x31) | 0x80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&local_38,(uchar *)&local_39);
  }
  if (((uVar1 & 0x1fc0000000000) != 0) ||
     (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_39 = (allocator_type)((byte)(uVar1 >> 0x2a) | 0x80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&local_38,(uchar *)&local_39);
  }
  if (((uVar1 & 0x3f800000000) != 0) ||
     (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_39 = (allocator_type)((byte)(uVar1 >> 0x23) | 0x80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&local_38,(uchar *)&local_39);
  }
  if (((uVar1 & 0x7f0000000) != 0) ||
     (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_39 = (allocator_type)((byte)(uVar1 >> 0x1c) | 0x80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&local_38,(uchar *)&local_39);
  }
  if (((uVar1 & 0xfe00000) != 0) ||
     (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_39 = (allocator_type)((byte)(uVar1 >> 0x15) | 0x80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&local_38,(uchar *)&local_39);
  }
  if (((uVar1 & 0x1fc000) != 0) ||
     (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_39 = (allocator_type)((byte)(uVar1 >> 0xe) | 0x80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&local_38,(uchar *)&local_39);
  }
  if (((uVar1 & 0x3f80) != 0) ||
     (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_39 = (allocator_type)((byte)(uVar1 >> 7) | 0x80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&local_38,(uchar *)&local_39);
  }
  local_39 = (allocator_type)((byte)uVar1 & 0x7f);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&local_38,(uchar *)&local_39);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<uint8_t> midiMessage() const {
			std::vector<uint8_t> v{
				statusByte,
				static_cast<uint8_t>(type),
			};
			{// データサイズ
				std::vector<uint8_t> s = inner::getVariableValue(data.size());
				v.insert(v.end(), std::make_move_iterator(s.begin()), std::make_move_iterator(s.end()));
			}
			v.insert(v.end(), data.begin(), data.end());	// データ
			return v;
		}